

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelpostproc.h
# Opt level: O0

bool __thiscall
TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeTriang>_>::dataequal
          (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeTriang>_> *this,TPZMaterialData *d1,
          TPZMaterialData *d2)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  double *pdVar5;
  long in_RDX;
  long in_RSI;
  double dVar6;
  int64_t nshape2;
  int64_t nshape;
  int dim;
  REAL res;
  int i;
  REAL SMALLNUMBER;
  size_t in_stack_000003b8;
  char *in_stack_000003c0;
  undefined8 local_38;
  undefined4 local_2c;
  undefined1 local_1;
  
  if (*(int *)(in_RSI + 17000) == *(int *)(in_RDX + 17000)) {
    local_38 = 0.0;
    iVar1 = TPZVec<double>::NElements((TPZVec<double> *)(in_RSI + 0x41f8));
    iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RSI + 0x3900));
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDX + 0x3900));
    iVar4 = TPZVec<double>::NElements((TPZVec<double> *)(in_RDX + 0x41f8));
    if (((int)iVar1 == iVar4) && (iVar2 == iVar3)) {
      for (local_2c = 0; local_2c < (int)iVar1; local_2c = local_2c + 1) {
        pdVar5 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RSI + 0x41f8),(long)local_2c);
        dVar6 = *pdVar5;
        pdVar5 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDX + 0x41f8),(long)local_2c);
        dVar6 = pow(dVar6 - *pdVar5,2.0);
        local_38 = dVar6 + local_38;
      }
      if (local_38 <= 1e-08) {
        local_1 = true;
      }
      else {
        pzinternal::DebugStopImpl(in_stack_000003c0,in_stack_000003b8);
        local_1 = false;
      }
    }
    else {
      pzinternal::DebugStopImpl(in_stack_000003c0,in_stack_000003b8);
      local_1 = false;
    }
  }
  else {
    pzinternal::DebugStopImpl(in_stack_000003c0,in_stack_000003b8);
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool TPZCompElPostProc<TCOMPEL>::dataequal(TPZMaterialData &d1,TPZMaterialData &d2)
{
    const REAL SMALLNUMBER = 1.e-8;
    int i;
    if(d1.p!=d2.p)
    {
        DebugStop();
        return 0;
    }
    REAL res = 0;
    int dim = d1.x.NElements();
    int64_t nshape = d1.phi.Rows();
    int64_t nshape2 = d2.phi.Rows();
    if(dim != d2.x.NElements() || nshape!= nshape2)
    {
        DebugStop();
        return 0; // dimensions and number of integration points shall match
    }
    
    for(i = 0; i < dim; i++)res += pow(d1.x[i]-d2.x[i],(REAL)2.0); // integration points must be at the same locations
    if(res > SMALLNUMBER)
    {
        DebugStop();
        return 0;
    }
    return 1;
}